

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

void dumpTypeName(raw_ostream *OS,DWARFDie *D)

{
  DWARFDebugInfoEntry **this;
  bool bVar1;
  bool bVar2;
  Tag TVar3;
  uint uVar4;
  char *Str;
  DWARFDie *this_00;
  raw_ostream *OS_00;
  undefined1 local_b0 [8];
  DWARFDie Cont;
  DWARFDie *C;
  iterator __end2;
  iterator __begin2;
  iterator_range<llvm::DWARFDie::iterator> *__range2;
  undefined1 auStack_38 [7];
  bool First;
  DWARFDie TypeDie;
  Tag T;
  char *Name;
  DWARFDie *D_local;
  raw_ostream *OS_local;
  
  bVar1 = llvm::DWARFDie::isValid(D);
  if (bVar1) {
    Str = llvm::DWARFDie::getName(D,LinkageName);
    if (Str == (char *)0x0) {
      TypeDie.Die._6_2_ = llvm::DWARFDie::getTag(D);
      uVar4 = (uint)TypeDie.Die._6_2_;
      if ((((uVar4 != 1) && (1 < uVar4 - 0xf)) && (uVar4 != 0x15)) &&
         ((uVar4 != 0x1f && (uVar4 != 0x42)))) {
        dumpTypeTagName(OS,TypeDie.Die._6_2_);
      }
      _auStack_38 = llvm::DWARFDie::getAttributeValueAsReferencedDie(D,DW_AT_type);
      dumpTypeName(OS,(DWARFDie *)auStack_38);
      if (TypeDie.Die._6_2_ == DW_TAG_array_type) {
        dumpArrayType(OS,D);
      }
      else if (TypeDie.Die._6_2_ == DW_TAG_pointer_type) {
        llvm::raw_ostream::operator<<(OS,'*');
      }
      else if (TypeDie.Die._6_2_ == DW_TAG_reference_type) {
        llvm::raw_ostream::operator<<(OS,'&');
      }
      else if (TypeDie.Die._6_2_ == DW_TAG_subroutine_type) {
        bVar1 = llvm::DWARFDie::operator_cast_to_bool((DWARFDie *)auStack_38);
        if (!bVar1) {
          llvm::raw_ostream::operator<<(OS,"void");
        }
        llvm::raw_ostream::operator<<(OS,'(');
        bVar1 = true;
        llvm::DWARFDie::children((iterator_range<llvm::DWARFDie::iterator> *)&__begin2.Die.Die,D);
        this = &__begin2.Die.Die;
        join_0x00000010_0x00000000_ =
             (DWARFDie)
             llvm::iterator_range<llvm::DWARFDie::iterator>::begin
                       ((iterator_range<llvm::DWARFDie::iterator> *)this);
        _C = (DWARFDie)
             llvm::iterator_range<llvm::DWARFDie::iterator>::end
                       ((iterator_range<llvm::DWARFDie::iterator> *)this);
        while (bVar2 = llvm::operator!=((iterator *)&__end2.Die.Die,(iterator *)&C), bVar2) {
          this_00 = llvm::DWARFDie::iterator::operator*((iterator *)&__end2.Die.Die);
          TVar3 = llvm::DWARFDie::getTag(this_00);
          if (TVar3 == DW_TAG_formal_parameter) {
            if (!bVar1) {
              llvm::raw_ostream::operator<<(OS,", ");
            }
            bVar1 = false;
            join_0x00000010_0x00000000_ =
                 llvm::DWARFDie::getAttributeValueAsReferencedDie(this_00,DW_AT_type);
            dumpTypeName(OS,(DWARFDie *)&Cont.Die);
          }
          llvm::DWARFDie::iterator::operator++((iterator *)&__end2.Die.Die);
        }
        llvm::raw_ostream::operator<<(OS,')');
      }
      else if (TypeDie.Die._6_2_ == DW_TAG_ptr_to_member_type) {
        _local_b0 = llvm::DWARFDie::getAttributeValueAsReferencedDie(D,DW_AT_containing_type);
        bVar1 = llvm::DWARFDie::operator_cast_to_bool((DWARFDie *)local_b0);
        if (bVar1) {
          OS_00 = llvm::raw_ostream::operator<<(OS,' ');
          dumpTypeName(OS_00,(DWARFDie *)local_b0);
          llvm::raw_ostream::operator<<(OS,"::");
        }
        llvm::raw_ostream::operator<<(OS,'*');
      }
      else if (TypeDie.Die._6_2_ == DW_TAG_rvalue_reference_type) {
        llvm::raw_ostream::operator<<(OS,"&&");
      }
    }
    else {
      llvm::raw_ostream::operator<<(OS,Str);
    }
  }
  return;
}

Assistant:

static void dumpTypeName(raw_ostream &OS, const DWARFDie &D) {
  if (!D.isValid())
    return;

  if (const char *Name = D.getName(DINameKind::LinkageName)) {
    OS << Name;
    return;
  }

  // FIXME: We should have pretty printers per language. Currently we print
  // everything as if it was C++ and fall back to the TAG type name.
  const dwarf::Tag T = D.getTag();
  switch (T) {
  case DW_TAG_array_type:
  case DW_TAG_pointer_type:
  case DW_TAG_ptr_to_member_type:
  case DW_TAG_reference_type:
  case DW_TAG_rvalue_reference_type:
  case DW_TAG_subroutine_type:
    break;
  default:
    dumpTypeTagName(OS, T);
  }

  // Follow the DW_AT_type if possible.
  DWARFDie TypeDie = D.getAttributeValueAsReferencedDie(DW_AT_type);
  dumpTypeName(OS, TypeDie);

  switch (T) {
  case DW_TAG_subroutine_type: {
    if (!TypeDie)
      OS << "void";
    OS << '(';
    bool First = true;
    for (const DWARFDie &C : D.children()) {
      if (C.getTag() == DW_TAG_formal_parameter) {
        if (!First)
          OS << ", ";
        First = false;
        dumpTypeName(OS, C.getAttributeValueAsReferencedDie(DW_AT_type));
      }
    }
    OS << ')';
    break;
  }
  case DW_TAG_array_type: {
    dumpArrayType(OS, D);
    break;
  }
  case DW_TAG_pointer_type:
    OS << '*';
    break;
  case DW_TAG_ptr_to_member_type:
    if (DWARFDie Cont =
            D.getAttributeValueAsReferencedDie(DW_AT_containing_type)) {
      dumpTypeName(OS << ' ', Cont);
      OS << "::";
    }
    OS << '*';
    break;
  case DW_TAG_reference_type:
    OS << '&';
    break;
  case DW_TAG_rvalue_reference_type:
    OS << "&&";
    break;
  default:
    break;
  }
}